

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

vector<boost::any,_std::allocator<boost::any>_> * __thiscall
Scine::Core::ModuleManager::Impl::getAll(Impl *this,string *interface,string *moduleName)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *model_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  shared_ptr<Scine::Core::Module> *modulePtr_1;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  ModuleList *__range3_1;
  LibraryAndModules *source_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *model;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string modulePtrLower;
  shared_ptr<Scine::Core::Module> *modulePtr;
  const_iterator __end4;
  const_iterator __begin4;
  ModuleList *__range4;
  LibraryAndModules *source;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range3;
  string moduleNameLower;
  vector<boost::any,_std::allocator<boost::any>_> *models;
  undefined6 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined1 local_1d0 [8];
  reference local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  undefined1 local_1b0 [24];
  undefined1 *local_198;
  reference local_190;
  shared_ptr<Scine::Core::Module> *local_188;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_180;
  ModuleList *local_178;
  reference local_170;
  LibraryAndModules *local_168;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_160 [2];
  undefined1 local_150 [8];
  reference local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  undefined1 local_130 [24];
  undefined1 *local_118;
  int local_110;
  byte local_109;
  string local_108 [32];
  locale local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  reference local_a0;
  shared_ptr<Scine::Core::Module> *local_98;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_90;
  ModuleList *local_88;
  reference local_80;
  LibraryAndModules *local_78;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_70 [4];
  locale local_50 [8];
  string local_48 [39];
  byte local_21;
  undefined8 local_18;
  
  local_21 = 0;
  __rhs = in_RDI;
  local_18 = in_RDX;
  std::vector<boost::any,_std::allocator<boost::any>_>::vector
            ((vector<boost::any,_std::allocator<boost::any>_> *)0x129b1e);
  std::locale::locale(local_50);
  boost::algorithm::to_lower_copy<std::__cxx11::string>
            (in_RDI,(locale *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  std::locale::~locale(local_50);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (in_stack_fffffffffffffe07 =
           std::operator!=(in_stack_fffffffffffffdf0,
                           (char *)CONCAT17(in_stack_fffffffffffffdef,
                                            CONCAT16(in_stack_fffffffffffffdee,
                                                     in_stack_fffffffffffffde8))),
     (bool)in_stack_fffffffffffffe07)) {
    local_70[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)CONCAT17(in_stack_fffffffffffffdef,
                             CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
    local_78 = (LibraryAndModules *)
               std::
               vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
               ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                      *)CONCAT17(in_stack_fffffffffffffdef,
                                 CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffdf0,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   in_stack_fffffffffffffde8))), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                 ::operator*(local_70);
      local_88 = &local_80->modules;
      local_90._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdef,
                               CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      local_98 = (shared_ptr<Scine::Core::Module> *)
                 std::
                 vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                 ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdef,
                                   CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffdf0,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdef,
                                            CONCAT16(in_stack_fffffffffffffdee,
                                                     in_stack_fffffffffffffde8))), bVar1) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                   ::operator*(&local_90);
        peVar3 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x129c87);
        in_stack_fffffffffffffdf0 = &local_e0;
        (**(code **)(*(long *)peVar3 + 0x10))();
        std::locale::locale(local_e8);
        boost::algorithm::to_lower_copy<std::__cxx11::string>
                  (in_RDI,(locale *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        std::locale::~locale(local_e8);
        std::__cxx11::string::~string((string *)&local_e0);
        bVar1 = std::operator!=(in_stack_fffffffffffffdf0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   in_stack_fffffffffffffde8)));
        local_109 = 0;
        uVar4 = false;
        if (bVar1) {
          std::operator+(in_RSI,(char *)__rhs);
          local_109 = 1;
          uVar4 = std::operator!=(in_stack_fffffffffffffdf0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffdee,
                                                             in_stack_fffffffffffffde8)));
        }
        in_stack_fffffffffffffdee = uVar4;
        in_stack_fffffffffffffdef = in_stack_fffffffffffffdee;
        if ((local_109 & 1) != 0) {
          std::__cxx11::string::~string(local_108);
        }
        if ((in_stack_fffffffffffffdee & 1) == 0) {
          peVar3 = std::
                   __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x129e26);
          (**(code **)(*(long *)peVar3 + 0x30))(local_130,peVar3,local_18);
          local_118 = local_130;
          local_138._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdef,
                                   CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
          local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffdef,
                                        CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8
                                                )));
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)in_stack_fffffffffffffdf0,
                                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffdef,
                                                CONCAT16(in_stack_fffffffffffffdee,
                                                         in_stack_fffffffffffffde8))), bVar1) {
            local_148 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_138);
            peVar3 = std::
                     __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x129ed1);
            (**(code **)(*(long *)peVar3 + 0x18))(local_150,peVar3,local_18,local_148);
            std::vector<boost::any,_std::allocator<boost::any>_>::push_back
                      ((vector<boost::any,_std::allocator<boost::any>_> *)in_stack_fffffffffffffdf0,
                       (value_type *)
                       CONCAT17(in_stack_fffffffffffffdef,
                                CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
            boost::any::~any((any *)in_stack_fffffffffffffdf0);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_138);
          }
          local_110 = 6;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
          local_21 = 1;
          local_110 = 1;
        }
        else {
          local_110 = 5;
        }
        std::__cxx11::string::~string(local_c0);
        if (local_110 != 5) goto LAB_0012a22e;
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_90);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_70);
    }
    local_21 = 1;
    local_110 = 1;
  }
  else {
    local_160[0]._M_current =
         (LibraryAndModules *)
         std::
         vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
         ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                  *)CONCAT17(in_stack_fffffffffffffdef,
                             CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
    local_168 = (LibraryAndModules *)
                std::
                vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                       *)CONCAT17(in_stack_fffffffffffffdef,
                                  CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)in_stack_fffffffffffffdf0,
                              (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                               *)CONCAT17(in_stack_fffffffffffffdef,
                                          CONCAT16(in_stack_fffffffffffffdee,
                                                   in_stack_fffffffffffffde8))), bVar1) {
      local_170 = __gnu_cxx::
                  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                  ::operator*(local_160);
      local_178 = &local_170->modules;
      local_180._M_current =
           (shared_ptr<Scine::Core::Module> *)
           std::
           vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                    *)CONCAT17(in_stack_fffffffffffffdef,
                               CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      local_188 = (shared_ptr<Scine::Core::Module> *)
                  std::
                  vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                         *)CONCAT17(in_stack_fffffffffffffdef,
                                    CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)in_stack_fffffffffffffdf0,
                                (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffdef,
                                            CONCAT16(in_stack_fffffffffffffdee,
                                                     in_stack_fffffffffffffde8))), bVar1) {
        local_190 = __gnu_cxx::
                    __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                    ::operator*(&local_180);
        peVar3 = std::
                 __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12a0d9);
        (**(code **)(*(long *)peVar3 + 0x30))(local_1b0,peVar3,local_18);
        local_198 = local_1b0;
        local_1b8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT17(in_stack_fffffffffffffdef,
                                 CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
        local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT17(in_stack_fffffffffffffdef,
                                      CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8))
                         );
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)in_stack_fffffffffffffdf0,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffdef,
                                              CONCAT16(in_stack_fffffffffffffdee,
                                                       in_stack_fffffffffffffde8))), bVar1) {
          local_1c8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&local_1b8);
          peVar3 = std::
                   __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x12a169);
          (**(code **)(*(long *)peVar3 + 0x18))(local_1d0,peVar3,local_18,local_1c8);
          std::vector<boost::any,_std::allocator<boost::any>_>::push_back
                    ((vector<boost::any,_std::allocator<boost::any>_> *)in_stack_fffffffffffffdf0,
                     (value_type *)
                     CONCAT17(in_stack_fffffffffffffdef,
                              CONCAT16(in_stack_fffffffffffffdee,in_stack_fffffffffffffde8)));
          boost::any::~any((any *)in_stack_fffffffffffffdf0);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_1b8);
        }
        local_110 = 0xc;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
        ::operator++(&local_180);
      }
      __gnu_cxx::
      __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
      ::operator++(local_160);
    }
    local_21 = 1;
    local_110 = 1;
  }
LAB_0012a22e:
  std::__cxx11::string::~string(local_48);
  if ((local_21 & 1) == 0) {
    std::vector<boost::any,_std::allocator<boost::any>_>::~vector
              ((vector<boost::any,_std::allocator<boost::any>_> *)
               CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
  }
  return (vector<boost::any,_std::allocator<boost::any>_> *)__rhs;
}

Assistant:

std::vector<boost::any> getAll(const std::string& interface, const std::string& moduleName) const {
    std::vector<boost::any> models;

    std::string moduleNameLower = boost::algorithm::to_lower_copy(moduleName);
    if (!moduleName.empty() && moduleNameLower != "any") {
      for (const auto& source : _sources) {
        for (const auto& modulePtr : source.modules) {
          std::string modulePtrLower = boost::algorithm::to_lower_copy(modulePtr->name());
          if ((modulePtrLower != moduleNameLower) && (modulePtrLower != moduleNameLower + "module")) {
            continue;
          }

          for (const auto& model : modulePtr->announceModels(interface)) {
            models.push_back(modulePtr->get(interface, model));
          }

          return models;
        }
      }
      return models;
    }

    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        for (const auto& model : modulePtr->announceModels(interface)) {
          models.push_back(modulePtr->get(interface, model));
        }
      }
    }

    return models;
  }